

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int reparse_unary_expr(lyxp_expr *exp,uint16_t *exp_idx)

{
  uint16_t exp_idx_00;
  int iVar1;
  bool bVar2;
  uint16_t prev_exp;
  uint16_t *exp_idx_local;
  lyxp_expr *exp_local;
  
  while( true ) {
    iVar1 = exp_check_token(exp,*exp_idx,LYXP_TOKEN_OPERATOR_MATH,0);
    bVar2 = false;
    if (iVar1 == 0) {
      bVar2 = exp->expr[exp->expr_pos[*exp_idx]] == '-';
    }
    if (!bVar2) break;
    *exp_idx = *exp_idx + 1;
  }
  exp_idx_00 = *exp_idx;
  iVar1 = reparse_path_expr(exp,exp_idx);
  while( true ) {
    if (iVar1 != 0) {
      return -1;
    }
    iVar1 = exp_check_token(exp,*exp_idx,LYXP_TOKEN_OPERATOR_UNI,0);
    if (iVar1 != 0) break;
    exp_repeat_push(exp,exp_idx_00,*exp_idx);
    *exp_idx = *exp_idx + 1;
    exp_idx_00 = *exp_idx;
    iVar1 = reparse_path_expr(exp,exp_idx);
  }
  return 0;
}

Assistant:

static int
reparse_unary_expr(struct lyxp_expr *exp, uint16_t *exp_idx)
{
    uint16_t prev_exp;

    /* ('-')* */
    while (!exp_check_token(exp, *exp_idx, LYXP_TOKEN_OPERATOR_MATH, 0)
            && (exp->expr[exp->expr_pos[*exp_idx]] == '-')) {
        ++(*exp_idx);
    }

    /* PathExpr */
    prev_exp = *exp_idx;
    if (reparse_path_expr(exp, exp_idx)) {
        return -1;
    }

    /* ('|' PathExpr)* */
    while (!exp_check_token(exp, *exp_idx, LYXP_TOKEN_OPERATOR_UNI, 0)) {
        exp_repeat_push(exp, prev_exp, *exp_idx);
        ++(*exp_idx);

        prev_exp = *exp_idx;
        if (reparse_path_expr(exp, exp_idx)) {
            return -1;
        }
    }

    return EXIT_SUCCESS;
}